

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O1

void __thiscall
zstr::istreambuf::istreambuf
          (istreambuf *this,streambuf *_sbuf_p,size_t _buff_size,bool _auto_detect,int _window_bits)

{
  char *pcVar1;
  char *pcVar2;
  
  *(code **)this = std::istream::_M_extract<double>;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::locale::locale((locale *)&this->field_0x38);
  *(undefined ***)this = &PTR__istreambuf_00448478;
  this->sbuf_p = _sbuf_p;
  (this->in_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  this->in_buff_start = (char *)0x0;
  this->in_buff_end = (char *)0x0;
  (this->out_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  (this->zstrm_p)._M_t.
  super___uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
  .super__Head_base<0UL,_zstr::detail::z_stream_wrapper_*,_false>._M_head_impl =
       (z_stream_wrapper *)0x0;
  this->buff_size = _buff_size;
  this->auto_detect = _auto_detect;
  this->auto_detect_run = false;
  this->is_text = false;
  this->window_bits = _window_bits;
  pcVar1 = (char *)operator_new__(_buff_size);
  (this->in_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = pcVar1;
  this->in_buff_start = pcVar1;
  this->in_buff_end = pcVar1;
  pcVar2 = (char *)operator_new__(this->buff_size);
  pcVar1 = (this->out_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  (this->out_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = pcVar2;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  pcVar1 = (this->out_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  *(char **)&this->field_0x8 = pcVar1;
  *(char **)&this->field_0x10 = pcVar1;
  *(char **)&this->field_0x18 = pcVar1;
  return;
}

Assistant:

istreambuf(std::streambuf* _sbuf_p,
             std::size_t _buff_size = default_buff_size,
             bool _auto_detect = true, int _window_bits = 0)
      : sbuf_p(_sbuf_p),
        in_buff(),
        in_buff_start(nullptr),
        in_buff_end(nullptr),
        out_buff(),
        zstrm_p(nullptr),
        buff_size(_buff_size),
        auto_detect(_auto_detect),
        auto_detect_run(false),
        is_text(false),
        window_bits(_window_bits) {
    assert(sbuf_p);
    in_buff = std::unique_ptr<char[]>(new char[buff_size]);
    in_buff_start = in_buff.get();
    in_buff_end = in_buff.get();
    out_buff = std::unique_ptr<char[]>(new char[buff_size]);
    setg(out_buff.get(), out_buff.get(), out_buff.get());
  }